

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTarget.cpp
# Opt level: O2

void __thiscall sf::RenderTarget::popGLStates(RenderTarget *this)

{
  bool bVar1;
  int iVar2;
  
  bVar1 = anon_unknown.dwarf_da44d::isActive(this->m_id);
  if (!bVar1) {
    iVar2 = (*this->_vptr_RenderTarget[3])(this,1);
    if ((char)iVar2 == '\0') {
      return;
    }
  }
  glMatrixMode(0x1701);
  priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/sfml-src/src/SFML/Graphics/RenderTarget.cpp"
                     ,0x1d3,"glMatrixMode(GL_PROJECTION)");
  glPopMatrix();
  priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/sfml-src/src/SFML/Graphics/RenderTarget.cpp"
                     ,0x1d4,"glPopMatrix()");
  glMatrixMode(0x1700);
  priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/sfml-src/src/SFML/Graphics/RenderTarget.cpp"
                     ,0x1d5,"glMatrixMode(GL_MODELVIEW)");
  glPopMatrix();
  priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/sfml-src/src/SFML/Graphics/RenderTarget.cpp"
                     ,0x1d6,"glPopMatrix()");
  glMatrixMode(0x1702);
  priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/sfml-src/src/SFML/Graphics/RenderTarget.cpp"
                     ,0x1d7,"glMatrixMode(GL_TEXTURE)");
  glPopMatrix();
  priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/sfml-src/src/SFML/Graphics/RenderTarget.cpp"
                     ,0x1d8,"glPopMatrix()");
  glPopClientAttrib();
  priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/sfml-src/src/SFML/Graphics/RenderTarget.cpp"
                     ,0x1da,"glPopClientAttrib()");
  glPopAttrib();
  priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/sfml-src/src/SFML/Graphics/RenderTarget.cpp"
                     ,0x1db,"glPopAttrib()");
  return;
}

Assistant:

void RenderTarget::popGLStates()
{
    if (isActive(m_id) || setActive(true))
    {
        glCheck(glMatrixMode(GL_PROJECTION));
        glCheck(glPopMatrix());
        glCheck(glMatrixMode(GL_MODELVIEW));
        glCheck(glPopMatrix());
        glCheck(glMatrixMode(GL_TEXTURE));
        glCheck(glPopMatrix());
        #ifndef SFML_OPENGL_ES
            glCheck(glPopClientAttrib());
            glCheck(glPopAttrib());
        #endif
    }
}